

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O1

void __thiscall
QPDFAcroFormDocumentHelper::transformAnnotations
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *old_annots,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *new_annots,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *new_fields,
          set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *old_fields,
          QPDFMatrix *cm,QPDF *from_qpdf,QPDFAcroFormDocumentHelper *from_afdh)

{
  string *key;
  QPDFObjectHandle *pQVar1;
  Rectangle r;
  element_type *peVar2;
  undefined8 uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Atomic_word *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined8 other;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  undefined7 extraout_var_00;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  QPDFObjGen *pQVar12;
  QPDFObjGen QVar13;
  QPDF_Dictionary *pQVar14;
  _Rb_tree_node_base *p_Var15;
  _Base_ptr p_Var16;
  _Node *p_Var17;
  const_iterator cVar18;
  mapped_type *value;
  long *plVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  element_type *peVar21;
  int i;
  undefined8 uVar22;
  QPDFAcroFormDocumentHelper *pQVar23;
  _Rb_tree_node_base *p_Var24;
  _Base_ptr p_Var25;
  QPDFAcroFormDocumentHelper *pQVar26;
  bool bVar27;
  QPDFAnnotationObjectHelper ah;
  bool have_parent;
  Matrix m1;
  T annot;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  dr_map;
  QPDFObjectHandle ffield_oh;
  QPDFObjectHandle from_dr;
  QPDFObjectHandle dr;
  list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> queue;
  QPDFObjectHandle top_field;
  QPDFObjectHandle new_matrix;
  string default_da;
  QPDFObjectHandle acroform;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> streams;
  QPDFObjectHandle dict;
  Rectangle rect;
  QPDFObjectHandle apdict;
  QPDFObjectHandle parent;
  QPDFObjectHandle from_acroform;
  QPDFObjGen parent_og;
  string from_default_da;
  anon_class_16_2_6a8246dc maybe_copy_object;
  map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
  orig_to_copy;
  iterator __begin1;
  iterator __end1;
  set added_new_fields;
  QPDFAnnotationObjectHelper local_558;
  byte local_51e;
  bool local_51d;
  uint local_51c;
  undefined1 local_518 [16];
  undefined1 local_508 [32];
  undefined1 local_4e8 [28];
  uint local_4cc;
  undefined1 local_4c8 [8];
  QPDFObjGen QStack_4c0;
  undefined1 local_4b8 [48];
  QPDFObjectHandle local_488;
  QPDFObjectHandle local_478;
  int local_464;
  undefined1 local_460 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  undefined1 local_428 [16];
  _Base_ptr local_418;
  QPDFObjGen QStack_410;
  undefined1 local_408 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e8;
  element_type *local_3e0;
  element_type *local_3d8;
  QPDFObjGen local_3d0;
  undefined1 local_3c8 [32];
  undefined1 local_3a8 [32];
  string local_388;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  _Base_ptr local_348;
  QPDFObjGen QStack_340;
  QPDFAcroFormDocumentHelper *local_330;
  QPDFAcroFormDocumentHelper *local_328;
  undefined1 local_320 [32];
  QPDFObjectHandle local_300;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [8];
  string local_2d8;
  ulong local_2b8;
  anon_class_16_2_6a8246dc local_2b0;
  QPDFObjectHandle local_2a0;
  QPDFObjectHandle local_290;
  QPDFObjGen local_280;
  QPDFObjGen local_278;
  QPDFObjGen local_270;
  QPDFObjGen local_268;
  QPDFObjectHandle local_260;
  QPDFObjectHandle local_250;
  QPDFObjectHandle local_240;
  QPDFObjGen local_230;
  element_type *local_228;
  QPDFObjGen local_220;
  QPDFObjGen local_218;
  QPDFObjectHandle local_210;
  QPDFArrayItems local_200;
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
  local_1f0;
  element_type *local_1c0;
  QPDFObjGen local_1b8;
  element_type *local_1b0;
  QPDFObjGen local_1a8;
  _Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  *local_1a0 [2];
  _Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  local_190;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_160;
  _Base_ptr local_158;
  QPDFObjGen local_150;
  QPDFObjectHandle local_148;
  iterator local_138;
  iterator local_110;
  Rectangle local_e8;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  local_98;
  QPDFAnnotationObjectHelper local_68;
  undefined7 extraout_var;
  
  local_4e8._16_8_ = (this->super_QPDFDocumentHelper).qpdf;
  local_190._24_8_ = old_fields;
  local_190._32_8_ = new_fields;
  local_160 = new_annots;
  if (from_qpdf == (QPDF *)0x0) {
    local_3d0.obj = 0;
    local_3d0.gen = 0;
    local_328 = this;
  }
  else {
    bVar27 = (QPDF *)local_4e8._16_8_ != from_qpdf;
    local_328 = from_afdh;
    local_4e8._16_8_ = from_qpdf;
    if (from_afdh == (QPDFAcroFormDocumentHelper *)0x0 && bVar27) {
      local_408._0_8_ = (QPDFAcroFormDocumentHelper *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<QPDFAcroFormDocumentHelper,std::allocator<QPDFAcroFormDocumentHelper>,QPDF&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8),
                 (QPDFAcroFormDocumentHelper **)local_408,
                 (allocator<QPDFAcroFormDocumentHelper> *)&local_558,from_qpdf);
      local_328 = (QPDFAcroFormDocumentHelper *)local_408._0_8_;
      local_3d0.obj = local_408._8_4_;
      local_3d0.gen = local_408._12_4_;
      local_408._0_8_ = (QPDFAcroFormDocumentHelper *)0x0;
      local_408._8_4_ = 0;
      local_408._12_4_ = 0;
    }
    else {
      local_3d0.obj = 0;
      local_3d0.gen = 0;
    }
  }
  local_3a8._24_8_ = (this->super_QPDFDocumentHelper).qpdf;
  local_330 = this;
  local_190._40_8_ = cm;
  QPDF::getRoot((QPDF *)&local_558);
  pQVar26 = (QPDFAcroFormDocumentHelper *)(local_408 + 0x10);
  local_408._0_8_ = pQVar26;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"/AcroForm","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_3c8,(string *)&local_558);
  if ((QPDFAcroFormDocumentHelper *)local_408._0_8_ != pQVar26) {
    operator_delete((void *)local_408._0_8_,CONCAT71(local_408._17_7_,local_408[0x10]) + 1);
  }
  if ((QPDFObjGen)
      local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  QPDF::getRoot((QPDF *)&local_558);
  local_408._0_8_ = pQVar26;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"/AcroForm","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_2f0,(string *)&local_558);
  if ((QPDFAcroFormDocumentHelper *)local_408._0_8_ != pQVar26) {
    operator_delete((void *)local_408._0_8_,CONCAT71(local_408._17_7_,local_408[0x10]) + 1);
  }
  if ((QPDFObjGen)
      local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length._0_4_ = 0;
  local_2d8._M_string_length._4_4_ = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  QPDFObjectHandle::newNull();
  if (local_4e8._16_8_ == local_3a8._24_8_) {
    local_4cc = 0;
    local_464 = 0;
    local_51c = 0;
  }
  else {
    local_408._8_4_ = 0;
    local_408._12_4_ = 0;
    local_408[0x10] = '\0';
    local_408._0_8_ = pQVar26;
    bVar27 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_3c8);
    uVar8 = 0;
    if (bVar27) {
      p_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8);
      local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"/DA","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4c8,(string *)local_3c8);
      bVar27 = QPDFObjectHandle::isString((QPDFObjectHandle *)local_4c8);
      if (QStack_4c0 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4c0);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
        operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 1));
      }
      if (bVar27) {
        local_4c8 = (undefined1  [8])local_4b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"/DA","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_1f0,(string *)local_3c8);
        QPDFObjectHandle::getUTF8Value_abi_cxx11_
                  ((string *)&local_558,(QPDFObjectHandle *)&local_1f0);
        std::__cxx11::string::operator=((string *)local_408,(string *)&local_558);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
          operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(local_1f0._M_impl.super__Rb_tree_header._M_header._4_4_,
                     local_1f0._M_impl.super__Rb_tree_header._M_header._M_color) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(local_1f0._M_impl.super__Rb_tree_header._M_header._4_4_,
                              local_1f0._M_impl.super__Rb_tree_header._M_header._M_color));
        }
        if (local_4c8 != (undefined1  [8])local_4b8) {
          operator_delete((void *)local_4c8,local_4b8._0_8_ + 1);
        }
      }
      local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"/Q","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4c8,(string *)local_3c8);
      bVar27 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_4c8);
      if (QStack_4c0 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4c0);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
        operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 1));
      }
      if (bVar27) {
        local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"/Q","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4c8,(string *)local_3c8);
        uVar8 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_4c8);
        if (QStack_4c0 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4c0);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
          operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi + 1));
        }
      }
    }
    bVar27 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_2f0);
    uVar11 = CONCAT71(extraout_var,bVar27);
    local_4cc = 0;
    if (bVar27) {
      p_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8);
      local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"/DR","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4c8,(string *)local_2f0);
      bVar27 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_4c8);
      if (QStack_4c0 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4c0);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
        operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 1));
      }
      if (bVar27) {
        local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"/DR","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4c8,(string *)local_2f0);
        _Var6._M_pi = local_488.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_488.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4c0;
        local_488.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_4c8;
        local_4c8 = (undefined1  [8])0x0;
        QStack_4c0.obj = 0;
        QStack_4c0.gen = 0;
        if ((QPDFObjGen)_Var6._M_pi != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        }
        if (QStack_4c0 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4c0);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
          operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi + 1));
        }
        bVar27 = QPDFObjectHandle::isIndirect(&local_488);
        if (!bVar27) {
          local_1b0 = local_488.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1a8 = (QPDFObjGen)
                      local_488.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if ((QPDFObjGen)
              local_488.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (QPDFObjGen)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)
               ((long)local_488.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
               8) = *(_Atomic_word *)
                     ((long)local_488.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)
               ((long)local_488.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
               8) = *(_Atomic_word *)
                     ((long)local_488.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi + 8) + 1;
            }
          }
          QPDF::makeIndirectObject((QPDF *)&local_558,(QPDFObjectHandle *)local_4e8._16_8_);
          _Var6._M_pi = local_488.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ;
          local_488.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_488.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
          local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
          local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          if ((QPDFObjGen)_Var6._M_pi != (QPDFObjGen)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
          }
          if ((QPDFObjGen)
              local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0)
          {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          if (local_1a8 != (QPDFObjGen)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8);
          }
        }
        pQVar1 = (QPDFObjectHandle *)(local_330->super_QPDFDocumentHelper).qpdf;
        local_1c0 = local_488.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1b8 = (QPDFObjGen)
                    local_488.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((QPDFObjGen)
            local_488.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (QPDFObjGen)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_488.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8
             ) = *(_Atomic_word *)
                  ((long)local_488.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_488.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8
             ) = *(_Atomic_word *)
                  ((long)local_488.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 8) + 1;
          }
        }
        QPDF::copyForeignObject((QPDF *)&local_558,pQVar1);
        _Var6._M_pi = local_488.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_488.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_488.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
        local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
        local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        if ((QPDFObjGen)_Var6._M_pi != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        }
        if ((QPDFObjGen)
            local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        if (local_1b8 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8);
        }
      }
      local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"/DA","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4c8,(string *)local_2f0);
      bVar27 = QPDFObjectHandle::isString((QPDFObjectHandle *)local_4c8);
      if (QStack_4c0 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4c0);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
        operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 1));
      }
      if (bVar27) {
        local_4c8 = (undefined1  [8])local_4b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"/DA","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_1f0,(string *)local_2f0);
        QPDFObjectHandle::getUTF8Value_abi_cxx11_
                  ((string *)&local_558,(QPDFObjectHandle *)&local_1f0);
        std::__cxx11::string::operator=((string *)(local_2e0 + 8),(string *)&local_558);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
          operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(local_1f0._M_impl.super__Rb_tree_header._M_header._4_4_,
                     local_1f0._M_impl.super__Rb_tree_header._M_header._M_color) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(local_1f0._M_impl.super__Rb_tree_header._M_header._4_4_,
                              local_1f0._M_impl.super__Rb_tree_header._M_header._M_color));
        }
        if (local_4c8 != (undefined1  [8])local_4b8) {
          operator_delete((void *)local_4c8,local_4b8._0_8_ + 1);
        }
      }
      local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"/Q","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4c8,(string *)local_2f0);
      bVar27 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_4c8);
      uVar11 = CONCAT71(extraout_var_00,bVar27);
      if (QStack_4c0 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4c0);
        uVar11 = extraout_RAX;
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
        operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 1));
        uVar11 = extraout_RAX_00;
      }
      if (bVar27) {
        local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"/Q","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4c8,(string *)local_2f0);
        local_4cc = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_4c8);
        uVar11 = (ulong)local_4cc;
        if (QStack_4c0 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4c0);
          uVar11 = extraout_RAX_01;
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
          operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi + 1));
          uVar11 = extraout_RAX_02;
        }
      }
    }
    uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
    local_51c = (uint)uVar11;
    if (local_2d8._M_string_length == local_408._8_8_) {
      if ((QPDFObjGen)local_2d8._M_string_length == (QPDFObjGen)0x0) {
        local_51c = 0;
      }
      else {
        iVar9 = bcmp(local_2d8._M_dataplus._M_p,(void *)local_408._0_8_,local_2d8._M_string_length);
        local_51c = CONCAT31((int3)((uint)iVar9 >> 8),iVar9 != 0);
        uVar11 = (ulong)local_51c;
      }
    }
    local_464 = (int)CONCAT71((int7)(uVar11 >> 8),local_4cc != uVar8);
    if ((QPDFAcroFormDocumentHelper *)local_408._0_8_ != pQVar26) {
      operator_delete((void *)local_408._0_8_,CONCAT71(local_408._17_7_,local_408[0x10]) + 1);
    }
  }
  pQVar26 = local_330;
  local_4b8._8_8_ = &QStack_4c0;
  QStack_4c0 = (QPDFObjGen)((ulong)QStack_4c0 & 0xffffffff00000000);
  local_4b8._0_8_ = 0;
  local_4b8._24_8_ = 0;
  local_4b8._16_8_ = local_4b8._8_8_;
  QPDFObjectHandle::newNull();
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1f0._M_impl.super__Rb_tree_header._M_header;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b0.orig_to_copy =
       (map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
        *)&local_1f0;
  local_2b0.this = pQVar26;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  QPDFObjectHandle::aitems(old_annots);
  QPDFObjectHandle::QPDFArrayItems::begin(&local_138,&local_200);
  QPDFObjectHandle::QPDFArrayItems::end(&local_110,&local_200);
  local_51e = (byte)local_464 | (byte)local_51c;
  local_190._16_8_ = &local_190;
  local_2b8 = 0;
  do {
    bVar27 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==(&local_138,&local_110);
    if (bVar27) {
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&local_110);
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&local_138);
      if (local_200.oh.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_200.oh.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree(&local_c8);
      std::
      _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
      ::~_Rb_tree(&local_1f0);
      if ((element_type *)
          local_478.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_478.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   *)local_4c8);
      if ((QPDFObjGen)
          local_488.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_488.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,
                        CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                                 local_2d8.field_2._M_local_buf[0]) + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._8_8_);
      }
      if ((QPDFObjGen)local_3c8._8_8_ != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._8_8_);
      }
      if (local_3d0 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d0);
      }
      return;
    }
    pQVar12 = (QPDFObjGen *)QPDFObjectHandle::QPDFArrayItems::iterator::operator*(&local_138);
    local_4e8._0_8_ = *pQVar12;
    local_4e8._8_8_ = pQVar12[1];
    if ((QPDFObjGen)local_4e8._8_8_ != (QPDFObjGen)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_4e8._8_8_ + 8) = *(_Atomic_word *)(local_4e8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_4e8._8_8_ + 8) = *(_Atomic_word *)(local_4e8._8_8_ + 8) + 1;
      }
    }
    bVar27 = QPDFObjectHandle::isStream((QPDFObjectHandle *)(local_508 + 0x20));
    if (bVar27) {
      local_408._0_8_ = local_408 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,"ignoring annotation that\'s a stream","");
      QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)(local_508 + 0x20),(string *)local_408);
      if ((QPDFAcroFormDocumentHelper *)local_408._0_8_ !=
          (QPDFAcroFormDocumentHelper *)(local_408 + 0x10)) {
        operator_delete((void *)local_408._0_8_,CONCAT71(local_408._17_7_,local_408[0x10]) + 1);
      }
    }
    else {
      local_210.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_4e8._0_8_;
      local_210.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_;
      if ((QPDFObjGen)local_4e8._8_8_ != (QPDFObjGen)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_4e8._8_8_ + 8) = *(_Atomic_word *)(local_4e8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_4e8._8_8_ + 8) = *(_Atomic_word *)(local_4e8._8_8_ + 8) + 1;
        }
      }
      QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper(&local_68,&local_210);
      getFieldForAnnotation((QPDFFormFieldObjectHelper *)local_408,local_328,&local_68);
      QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_68);
      if ((QPDFObjGen)
          local_210.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_210.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      local_4b8._40_8_ = CONCAT71(local_408._17_7_,local_408[0x10]);
      local_4b8._32_8_ = local_408._8_8_;
      if ((element_type *)local_4b8._40_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5 = (_Atomic_word *)
                   ((long)&(((element_type *)local_4b8._40_8_)->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   + 8);
          *p_Var5 = *p_Var5 + 1;
          UNLOCK();
        }
        else {
          p_Var5 = (_Atomic_word *)
                   ((long)&(((element_type *)local_4b8._40_8_)->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   + 8);
          *p_Var5 = *p_Var5 + 1;
        }
      }
      local_460._24_4_ = 0;
      local_460._28_4_ = 0;
      local_460._32_4_ = 0;
      local_460._36_4_ = 0;
      local_51d = false;
      bVar27 = QPDFObjectHandle::isStream((QPDFObjectHandle *)((long)local_4b8 + 0x20));
      if (bVar27) {
        local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
             (_func_int **)((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_558,"ignoring form field that\'s a stream","");
        QPDFObjectHandle::warnIfPossible
                  ((QPDFObjectHandle *)((long)local_4b8 + 0x20),(string *)&local_558);
LAB_00159a30:
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
            (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
          operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi + 1));
        }
LAB_00159a85:
        bVar27 = false;
      }
      else {
        bVar27 = QPDFObjectHandle::isNull((QPDFObjectHandle *)((long)local_4b8 + 0x20));
        if ((!bVar27) &&
           (bVar27 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)((long)local_4b8 + 0x20)),
           !bVar27)) {
          local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_558,"ignoring form field not indirect","");
          QPDFObjectHandle::warnIfPossible
                    ((QPDFObjectHandle *)((long)local_4b8 + 0x20),(string *)&local_558);
          goto LAB_00159a30;
        }
        bVar27 = QPDFObjectHandle::isNull((QPDFObjectHandle *)((long)local_4b8 + 0x20));
        if (bVar27) goto LAB_00159a85;
        QPDFFormFieldObjectHelper::getTopLevelField
                  ((QPDFFormFieldObjectHelper *)&local_558,(QPDFFormFieldObjectHelper *)local_408,
                   &local_51d);
        uVar3 = local_460._32_8_;
        if ((QPDFObjGen)
            local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (QPDFObjGen)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8
             ) = *(_Atomic_word *)
                  ((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8
             ) = *(_Atomic_word *)
                  ((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 8) + 1;
          }
        }
        local_460._24_8_ =
             local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_460._32_8_ =
             local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((QPDFObjGen)uVar3 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
        }
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)&local_558);
        if (local_4e8._16_8_ == local_3a8._24_8_) {
          local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)(local_460 + 0x18));
          std::
          _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
          ::_M_insert_unique<QPDFObjGen>
                    ((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                      *)local_190._24_8_,(QPDFObjGen *)&local_558);
        }
        else {
          pQVar1 = (QPDFObjectHandle *)(pQVar26->super_QPDFDocumentHelper).qpdf;
          local_220.obj = local_460._24_4_;
          local_220.gen = local_460._28_4_;
          local_218.obj = local_460._32_4_;
          local_218.gen = local_460._36_4_;
          if ((QPDFObjGen)local_460._32_8_ != (QPDFObjGen)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_460._32_8_ + 8) = *(_Atomic_word *)(local_460._32_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_460._32_8_ + 8) = *(_Atomic_word *)(local_460._32_8_ + 8) + 1;
            }
          }
          QPDF::copyForeignObject((QPDF *)&local_558,pQVar1);
          uVar3 = local_460._32_8_;
          local_460._32_8_ =
               local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_460._24_8_ = local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
          local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
          local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          if ((QPDFObjGen)uVar3 != (QPDFObjGen)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
          }
          if (local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          if (local_218 != (QPDFObjGen)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218);
          }
          pQVar1 = (QPDFObjectHandle *)(pQVar26->super_QPDFDocumentHelper).qpdf;
          local_230.obj = local_4b8._32_4_;
          local_230.gen = local_4b8._36_4_;
          local_228 = (element_type *)local_4b8._40_8_;
          if ((element_type *)local_4b8._40_8_ != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_4b8._40_8_ + 8) = *(_Atomic_word *)(local_4b8._40_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_4b8._40_8_ + 8) = *(_Atomic_word *)(local_4b8._40_8_ + 8) + 1;
            }
          }
          QPDF::copyForeignObject((QPDF *)&local_558,pQVar1);
          uVar3 = local_4b8._40_8_;
          local_4b8._40_8_ =
               local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_4b8._32_8_ = local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
          local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
          local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          if ((element_type *)uVar3 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
          }
          if ((QPDFObjGen)
              local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0)
          {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          if (local_228 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228);
          }
        }
        local_460._0_8_ = local_460;
        local_460._16_8_ = 0;
        local_368._8_8_ = local_368._8_8_ & 0xffffffff00000000;
        local_358._0_4_ = 0;
        local_358._4_4_ = 0;
        local_358._8_8_ = local_368 + 8;
        QStack_340.obj = 0;
        QStack_340.gen = 0;
        local_460._8_8_ = local_460._0_8_;
        local_348 = (_Base_ptr)local_358._8_8_;
        bVar27 = transformAnnotations::anon_class_16_2_6a8246dc::operator()
                           (&local_2b0,(QPDFObjectHandle *)(local_460 + 0x18));
        if (bVar27) {
          p_Var17 = std::__cxx11::list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
                    _M_create_node<QPDFObjectHandle_const&>
                              ((list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)local_460,
                               (QPDFObjectHandle *)(local_460 + 0x18));
          std::__detail::_List_node_base::_M_hook(&p_Var17->super__List_node_base);
          local_460._16_8_ = local_460._16_8_ + 1;
        }
        if ((element_type *)local_460._0_8_ != (element_type *)local_460) {
          do {
            uVar3 = local_460._0_8_;
            key = (string *)(local_460._0_8_ + 0x10);
            QVar13 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)key);
            bVar27 = QPDFObjGen::set::add((set *)local_368,QVar13);
            if (bVar27) {
              local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                   (_func_int **)((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8);
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"/Parent","");
              QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_320 + 0x20),key);
              if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
                  (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
                operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi + 1));
              }
              bVar27 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)(local_320 + 0x20));
              if (bVar27) {
                local_2e0 = (undefined1  [8])
                            QPDFObjectHandle::getObjGen((QPDFObjectHandle *)(local_320 + 0x20));
                cVar18 = std::
                         _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                         ::find(&local_1f0,(key_type *)local_2e0);
                if ((_Rb_tree_header *)cVar18._M_node == &local_1f0._M_impl.super__Rb_tree_header) {
                  local_150 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)key);
                  QPDFObjGen::unparse_abi_cxx11_((string *)local_320,&local_150,',');
                  plVar19 = (long *)std::__cxx11::string::replace
                                              ((ulong)local_320,0,(char *)0x0,0x2677e3);
                  peVar21 = (element_type *)(plVar19 + 2);
                  if ((element_type *)*plVar19 == peVar21) {
                    local_3a8._0_8_ =
                         *(undefined8 *)
                          &(peVar21->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ;
                    local_3a8._8_8_ = plVar19[3];
                    local_3c8._16_8_ = (element_type *)local_3a8;
                  }
                  else {
                    local_3a8._0_8_ =
                         *(undefined8 *)
                          &(peVar21->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ;
                    local_3c8._16_8_ = (element_type *)*plVar19;
                  }
                  local_3c8._24_8_ = plVar19[1];
                  *plVar19 = (long)peVar21;
                  plVar19[1] = 0;
                  *(undefined1 *)(plVar19 + 2) = 0;
                  plVar19 = (long *)std::__cxx11::string::append(local_3c8 + 0x10);
                  local_438._M_allocated_capacity = (size_type)local_428;
                  p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar19 + 2);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar19 == p_Var20) {
                    local_428._0_8_ = p_Var20->_vptr__Sp_counted_base;
                    local_428._8_8_ = plVar19[3];
                  }
                  else {
                    local_428._0_8_ = p_Var20->_vptr__Sp_counted_base;
                    local_438._M_allocated_capacity =
                         (size_type)(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar19;
                  }
                  local_438._8_8_ = plVar19[1];
                  *plVar19 = (long)p_Var20;
                  plVar19[1] = 0;
                  *(undefined1 *)(plVar19 + 2) = 0;
                  QPDFObjGen::unparse_abi_cxx11_
                            ((string *)(local_3a8 + 0x20),(QPDFObjGen *)local_2e0,',');
                  QVar13.obj = 0xf;
                  QVar13.gen = 0;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_438._M_allocated_capacity !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428) {
                    QVar13 = (QPDFObjGen)local_428._0_8_;
                  }
                  if ((ulong)QVar13 < local_388._M_string_length + local_438._8_8_) {
                    uVar22._0_4_ = 0xf;
                    uVar22._4_4_ = 0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_388._M_dataplus._M_p != &local_388.field_2) {
                      uVar22 = local_388.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar22 < local_388._M_string_length + local_438._8_8_)
                    goto LAB_0015a926;
                    plVar19 = (long *)std::__cxx11::string::replace
                                                ((ulong)(local_3a8 + 0x20),0,(char *)0x0,
                                                 local_438._M_allocated_capacity);
                  }
                  else {
LAB_0015a926:
                    plVar19 = (long *)std::__cxx11::string::_M_append
                                                (local_438._M_local_buf,
                                                 (ulong)local_388._M_dataplus._M_p);
                  }
                  local_518._0_8_ = local_508;
                  peVar21 = (element_type *)(plVar19 + 2);
                  if ((element_type *)*plVar19 == peVar21) {
                    local_508._0_8_ =
                         *(undefined8 *)
                          &(peVar21->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ;
                    local_508._8_8_ = plVar19[3];
                  }
                  else {
                    local_508._0_8_ =
                         *(undefined8 *)
                          &(peVar21->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ;
                    local_518._0_8_ = (element_type *)*plVar19;
                  }
                  local_518._8_8_ = plVar19[1];
                  *plVar19 = (long)peVar21;
                  plVar19[1] = 0;
                  *(undefined1 *)
                   &(peVar21->value).
                    super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       = 0;
                  plVar19 = (long *)std::__cxx11::string::append(local_518);
                  local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                       (_func_int **)((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8);
                  peVar21 = (element_type *)(plVar19 + 2);
                  if ((element_type *)*plVar19 == peVar21) {
                    local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          &(peVar21->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ;
                    local_558.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)plVar19[3];
                  }
                  else {
                    local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          &(peVar21->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ;
                    local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)*plVar19
                    ;
                  }
                  local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       *(element_type **)(plVar19 + 1);
                  *plVar19 = (long)peVar21;
                  plVar19[1] = 0;
                  *(undefined1 *)(plVar19 + 2) = 0;
                  QPDFObjectHandle::warnIfPossible
                            ((QPDFObjectHandle *)(local_320 + 0x20),(string *)&local_558);
                  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
                      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
                    operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                    (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.
                                                  obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi + 1));
                  }
                  if ((element_type *)local_518._0_8_ != (element_type *)local_508) {
                    operator_delete((void *)local_518._0_8_,local_508._0_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_388._M_dataplus._M_p != &local_388.field_2) {
                    operator_delete(local_388._M_dataplus._M_p,
                                    local_388.field_2._M_allocated_capacity + 1);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_438._M_allocated_capacity !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428) {
                    operator_delete((void *)local_438._M_allocated_capacity,local_428._0_8_ + 1);
                  }
                  if ((element_type *)local_3c8._16_8_ != (element_type *)local_3a8) {
                    operator_delete((void *)local_3c8._16_8_,local_3a8._0_8_ + 1);
                  }
                  QVar13 = (QPDFObjGen)local_320._16_8_;
                  peVar21 = (element_type *)local_320._0_8_;
                  if ((element_type *)local_320._0_8_ == (element_type *)(local_320 + 0x10))
                  goto LAB_0015aac3;
                }
                else {
                  local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                       (_func_int **)((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8);
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"/Parent","")
                  ;
                  value = std::
                          map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                          ::operator[]((map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                                        *)&local_1f0,(key_type *)local_2e0);
                  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)key,(string *)&local_558,value);
                  QVar13 = (QPDFObjGen)
                           local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
                  peVar21 = (element_type *)local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
                  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper ==
                      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8U))
                  goto LAB_0015aac3;
                }
                operator_delete(peVar21,(ulong)((long)QVar13 + 1));
              }
LAB_0015aac3:
              local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                   (_func_int **)((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8);
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"/Kids","");
              QPDFObjectHandle::getKey((QPDFObjectHandle *)local_320,key);
              if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
                  (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
                operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi + 1));
              }
              pQVar23 = (QPDFAcroFormDocumentHelper *)local_320;
              bVar27 = QPDFObjectHandle::isArray((QPDFObjectHandle *)pQVar23);
              if (bVar27) {
                iVar9 = 0;
                while( true ) {
                  pQVar23 = (QPDFAcroFormDocumentHelper *)local_320;
                  iVar10 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)pQVar23);
                  if (iVar10 <= iVar9) break;
                  QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_558,(int)local_320);
                  bVar27 = transformAnnotations::anon_class_16_2_6a8246dc::operator()
                                     (&local_2b0,(QPDFObjectHandle *)&local_558);
                  if (bVar27) {
                    QPDFObjectHandle::setArrayItem
                              ((QPDFObjectHandle *)local_320,iVar9,(QPDFObjectHandle *)&local_558);
                    p_Var17 = std::__cxx11::list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>
                              ::_M_create_node<QPDFObjectHandle_const&>
                                        ((list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)
                                         local_460,(QPDFObjectHandle *)&local_558);
                    std::__detail::_List_node_base::_M_hook(&p_Var17->super__List_node_base);
                    local_460._16_8_ = local_460._16_8_ + 1;
                  }
                  if ((QPDFObjGen)
                      local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                      (QPDFObjGen)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
                  }
                  iVar9 = iVar9 + 1;
                }
              }
              if (local_51e != 0) {
                local_240.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar3 + 0x10))->
                     _vptr__Sp_counted_base;
                local_240.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(uVar3 + 0x18);
                if (local_240.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_240.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_use_count = (local_240.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_240.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_use_count = (local_240.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                adjustInheritedFields
                          (pQVar23,&local_240,(bool)(byte)local_51c,(string *)(local_2e0 + 8),
                           local_464._0_1_,local_4cc);
                if (local_240.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_240.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
                }
              }
              if (local_4e8._16_8_ == local_3a8._24_8_) {
LAB_0015b050:
                bVar27 = false;
              }
              else {
                if ((local_2b8 & 1) == 0) {
                  bVar27 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_3c8);
                  if (!bVar27) {
                    getOrCreateAcroForm((QPDFAcroFormDocumentHelper *)&local_558);
                    uVar22 = local_3c8._8_8_;
                    local_3c8._8_8_ =
                         local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    local_3c8._0_8_ = local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
                    local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
                    local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    if ((QPDFObjGen)uVar22 != (QPDFObjGen)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar22);
                    }
                    if (local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                        (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
                    }
                  }
                  local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                       (_func_int **)((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8);
                  local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x3;
                  local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
                       = 0x52442f;
                  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_518,(string *)local_3c8);
                  _Var6._M_pi = local_478.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi;
                  local_478.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._8_8_;
                  local_478.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)local_518._0_8_;
                  local_518._0_8_ = (element_type *)0x0;
                  local_518._8_8_ = (element_type *)0x0;
                  if ((element_type *)_Var6._M_pi != (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
                  }
                  if ((element_type *)local_518._8_8_ != (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._8_8_);
                  }
                  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
                      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
                    operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                    (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.
                                                  obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi + 1));
                  }
                  bVar27 = QPDFObjectHandle::isDictionary(&local_478);
                  if (!bVar27) {
                    QPDFObjectHandle::newDictionary();
                    _Var6._M_pi = local_478.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                    local_478.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    local_478.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
                    local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
                    local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    if ((element_type *)_Var6._M_pi != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
                    }
                    if (local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                        (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
                    }
                  }
                  QPDFObjectHandle::makeResourcesIndirect
                            (&local_478,(pQVar26->super_QPDFDocumentHelper).qpdf);
                  bVar27 = QPDFObjectHandle::isIndirect(&local_478);
                  if (!bVar27) {
                    local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                         (_func_int **)
                         ((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8);
                    local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x3;
                    local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                    _0_4_ = 0x52442f;
                    pQVar1 = (QPDFObjectHandle *)(pQVar26->super_QPDFDocumentHelper).qpdf;
                    local_3c8._16_8_ =
                         local_478.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    local_3c8._24_8_ =
                         local_478.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi;
                    if ((element_type *)
                        local_478.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        != (element_type *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_478.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_M_use_count =
                             (local_478.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_478.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_M_use_count =
                             (local_478.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
                      }
                    }
                    QPDF::makeIndirectObject((QPDF *)&local_438._M_allocated_capacity,pQVar1);
                    QPDFObjectHandle::replaceKeyAndGetNew
                              ((QPDFObjectHandle *)local_518,(string *)local_3c8,
                               (QPDFObjectHandle *)&local_558);
                    _Var6._M_pi = local_478.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                    local_478.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._8_8_;
                    local_478.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)local_518._0_8_;
                    local_518._0_8_ = (element_type *)0x0;
                    local_518._8_8_ = (element_type *)0x0;
                    if ((element_type *)_Var6._M_pi != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
                    }
                    if ((element_type *)local_518._8_8_ != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._8_8_);
                    }
                    if ((_Base_ptr)local_438._8_8_ != (_Base_ptr)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_);
                    }
                    if ((element_type *)local_3c8._24_8_ != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._24_8_);
                    }
                    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                        local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
                        (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
                      operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                      (ulong)((long)local_558.super_QPDFObjectHelper.
                                                    super_BaseHandle.obj.
                                                                                                        
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi + 1));
                    }
                  }
                  QPDFObjectHandle::makeResourcesIndirect
                            (&local_488,(pQVar26->super_QPDFDocumentHelper).qpdf);
                  local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                       (_func_int **)
                       local_488.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)
                       local_488.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
                  peVar21 = local_488.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  if ((QPDFObjGen)
                      local_488.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (QPDFObjGen)0x0) {
                    peVar21 = (element_type *)&__libc_single_threaded;
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      *(_Atomic_word *)
                       ((long)local_488.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi + 8) =
                           *(_Atomic_word *)
                            ((long)local_488.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi + 8) + 1;
                      UNLOCK();
                    }
                    else {
                      *(_Atomic_word *)
                       ((long)local_488.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi + 8) =
                           *(_Atomic_word *)
                            ((long)local_488.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi + 8) + 1;
                    }
                  }
                  QPDFObjectHandle::mergeResources
                            (&local_478,(QPDFObjectHandle *)&local_558,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                              *)local_4c8);
                  if ((QPDFObjGen)
                      local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                      (QPDFObjGen)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
                  }
                  bVar27 = getNeedAppearances(local_328);
                  local_2b8 = CONCAT71((int7)((ulong)peVar21 >> 8),1);
                  if (bVar27) {
                    setNeedAppearances(pQVar26,true);
                  }
                }
                local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                     (_func_int **)((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8);
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"/DR","");
                bVar27 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)key,(string *)&local_558);
                if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
                    (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
                  operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                  (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.
                                                obj.
                                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi + 1));
                }
                if (bVar27) {
                  local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                       (_func_int **)((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8);
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"/DR","");
                  QPDFObjectHandle::replaceKey
                            ((QPDFObjectHandle *)key,(string *)&local_558,&local_478);
                  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
                      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
                    operator_delete(local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                    (ulong)((long)local_558.super_QPDFObjectHelper.super_BaseHandle.
                                                  obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi + 1));
                  }
                }
                local_1a0[0] = &local_190;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"/DA","");
                QPDFObjectHandle::getKey(&local_148,key);
                bVar27 = QPDFObjectHandle::isString(&local_148);
                if (!bVar27) goto LAB_0015b050;
                bVar27 = local_4b8._24_8_ != 0;
              }
              if (local_4e8._16_8_ != local_3a8._24_8_) {
                if (local_148.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_148.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
                }
                if (local_1a0[0] != &local_190) {
                  operator_delete(local_1a0[0],local_190._0_8_ + 1);
                }
              }
              if (bVar27) {
                local_250.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar3 + 0x10))->
                     _vptr__Sp_counted_base;
                local_250.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(uVar3 + 0x18);
                if (local_250.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_250.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_use_count = (local_250.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_250.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_use_count = (local_250.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                adjustDefaultAppearances
                          (pQVar26,&local_250,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                            *)local_4c8);
                if (local_250.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_250.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
                }
              }
              if ((element_type *)local_320._8_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._8_8_);
              }
              if (local_300.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_300.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
            }
            std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::_M_erase
                      ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_460,
                       (iterator)local_460._0_8_);
          } while ((element_type *)local_460._0_8_ != (element_type *)local_460);
        }
        transformAnnotations::anon_class_16_2_6a8246dc::operator()
                  (&local_2b0,(QPDFObjectHandle *)((long)local_4b8 + 0x20));
        local_260.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_4b8._32_8_;
        local_260.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b8._40_8_;
        if ((element_type *)local_4b8._40_8_ != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_4b8._40_8_ + 8) = *(_Atomic_word *)(local_4b8._40_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_4b8._40_8_ + 8) = *(_Atomic_word *)(local_4b8._40_8_ + 8) + 1;
          }
        }
        QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)&local_558,&local_260);
        local_408._8_8_ =
             local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 0x10),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&local_558.super_QPDFObjectHelper.super_BaseHandle + 8));
        local_408._24_8_ =
             local_558.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_3e8,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&local_558.super_QPDFObjectHelper.oh_ + 8));
        local_3e0 = local_558.m.
                    super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_3d8,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&local_558.m.
                           super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                   + 8));
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)&local_558);
        if ((element_type *)
            local_260.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_260.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        std::
        _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
        ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                     *)local_368);
        std::__cxx11::_List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::_M_clear
                  ((_List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_460);
        bVar27 = true;
      }
      if (local_4e8._16_8_ != local_3a8._24_8_) {
        bVar7 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)(local_508 + 0x20));
        if (!bVar7) {
          local_270.obj = local_4e8._0_4_;
          local_270.gen = local_4e8._4_4_;
          local_268.obj = local_4e8._8_4_;
          local_268.gen = local_4e8._12_4_;
          if ((QPDFObjGen)local_4e8._8_8_ != (QPDFObjGen)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_4e8._8_8_ + 8) = *(_Atomic_word *)(local_4e8._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_4e8._8_8_ + 8) = *(_Atomic_word *)(local_4e8._8_8_ + 8) + 1;
            }
          }
          QPDF::makeIndirectObject((QPDF *)&local_558,(QPDFObjectHandle *)local_4e8._16_8_);
          uVar3 = local_4e8._8_8_;
          local_4e8._8_8_ =
               local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_4e8._0_8_ = local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
          local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
          local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          if ((QPDFObjGen)uVar3 != (QPDFObjGen)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
          }
          if ((QPDFObjGen)
              local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0)
          {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          if (local_268 != (QPDFObjGen)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268);
          }
        }
        pQVar1 = (QPDFObjectHandle *)(pQVar26->super_QPDFDocumentHelper).qpdf;
        local_280.obj = local_4e8._0_4_;
        local_280.gen = local_4e8._4_4_;
        local_278.obj = local_4e8._8_4_;
        local_278.gen = local_4e8._12_4_;
        if ((QPDFObjGen)local_4e8._8_8_ != (QPDFObjGen)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_4e8._8_8_ + 8) = *(_Atomic_word *)(local_4e8._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_4e8._8_8_ + 8) = *(_Atomic_word *)(local_4e8._8_8_ + 8) + 1;
          }
        }
        QPDF::copyForeignObject((QPDF *)&local_558,pQVar1);
        uVar3 = local_4e8._8_8_;
        local_4e8._8_8_ =
             local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_4e8._0_8_ = local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
        local_558.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
        local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        if ((QPDFObjGen)uVar3 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
        }
        if ((QPDFObjGen)
            local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_558.super_QPDFObjectHelper.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        if (local_278 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278);
        }
      }
      transformAnnotations::anon_class_16_2_6a8246dc::operator()
                (&local_2b0,(QPDFObjectHandle *)(local_508 + 0x20));
      if (bVar27) {
        QVar13 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)(local_460 + 0x18));
        bVar27 = QPDFObjGen::set::add((set *)&local_c8,QVar13);
        if (bVar27) {
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_190._32_8_
                     ,(value_type *)(local_460 + 0x18));
        }
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                (local_160,(value_type *)(local_508 + 0x20));
      local_290.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_4e8._0_8_;
      local_290.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_;
      if ((QPDFObjGen)local_4e8._8_8_ != (QPDFObjGen)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_4e8._8_8_ + 8) = *(_Atomic_word *)(local_4e8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_4e8._8_8_ + 8) = *(_Atomic_word *)(local_4e8._8_8_ + 8) + 1;
        }
      }
      QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper(&local_558,&local_290);
      if ((QPDFObjGen)
          local_290.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_290.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      QPDFAnnotationObjectHelper::getAppearanceDictionary((QPDFAnnotationObjectHelper *)local_320);
      local_3c8._16_8_ = (element_type *)0x0;
      local_3c8._24_8_ = (element_type *)0x0;
      local_3a8._0_8_ = (_func_int **)0x0;
      local_518._0_8_ = local_320._0_8_;
      local_518._8_8_ = local_320._8_8_;
      if ((element_type *)local_320._8_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_320._8_8_ + 8) = *(_Atomic_word *)(local_320._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_320._8_8_ + 8) = *(_Atomic_word *)(local_320._8_8_ + 8) + 1;
        }
      }
      pQVar14 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)local_518);
      if (pQVar14 == (QPDF_Dictionary *)0x0) {
        p_Var16 = (_Base_ptr)0x0;
      }
      else {
        p_Var16 = (pQVar14->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      pQVar14 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)local_518);
      p_Var25 = &(pQVar14->items)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar14 == (QPDF_Dictionary *)0x0) {
        p_Var25 = (_Base_ptr)0x0;
      }
      local_158 = p_Var25;
      if (p_Var16 != p_Var25) {
        do {
          bVar27 = QPDFObjectHandle::isStream((QPDFObjectHandle *)(p_Var16 + 2));
          if (bVar27) {
            QPDFObjectHandle::copyStream((QPDFObjectHandle *)local_368);
            QPDFObjectHandle::replaceKeyAndGetNew
                      ((QPDFObjectHandle *)&local_438,(string *)local_320,
                       (QPDFObjectHandle *)(p_Var16 + 1));
            if ((_Base_ptr)local_368._8_8_ != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
            }
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
            emplace_back<QPDFObjectHandle>
                      ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                       (local_3c8 + 0x10),(QPDFObjectHandle *)&local_438);
            if ((_Base_ptr)local_438._8_8_ != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_);
            }
          }
          else {
            local_438._M_allocated_capacity = *(undefined8 *)(p_Var16 + 2);
            local_438._8_8_ = p_Var16[2]._M_parent;
            if ((_Base_ptr)local_438._8_8_ != (_Base_ptr)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&((_Base_ptr)local_438._8_8_)->_M_parent =
                     *(int *)&((_Base_ptr)local_438._8_8_)->_M_parent + 1;
                UNLOCK();
              }
              else {
                *(int *)&((_Base_ptr)local_438._8_8_)->_M_parent =
                     *(int *)&((_Base_ptr)local_438._8_8_)->_M_parent + 1;
              }
            }
            pQVar14 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)&local_438);
            if (pQVar14 == (QPDF_Dictionary *)0x0) {
              p_Var15 = (_Rb_tree_node_base *)0x0;
            }
            else {
              p_Var15 = (pQVar14->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            pQVar14 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)&local_438);
            p_Var24 = &(pQVar14->items)._M_t._M_impl.super__Rb_tree_header._M_header;
            if (pQVar14 == (QPDF_Dictionary *)0x0) {
              p_Var24 = (_Rb_tree_node_base *)0x0;
            }
            for (; p_Var15 != p_Var24;
                p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
              bVar27 = QPDFObjectHandle::isStream((QPDFObjectHandle *)(p_Var15 + 2));
              if (bVar27) {
                QPDFObjectHandle::copyStream((QPDFObjectHandle *)local_368);
                QPDFObjectHandle::replaceKeyAndGetNew
                          ((QPDFObjectHandle *)(local_3a8 + 0x20),(string *)(p_Var16 + 2),
                           (QPDFObjectHandle *)(p_Var15 + 1));
                if ((_Base_ptr)local_368._8_8_ != (_Base_ptr)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
                }
                std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
                emplace_back<QPDFObjectHandle>
                          ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                           (local_3c8 + 0x10),(QPDFObjectHandle *)(local_3a8 + 0x20));
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._M_string_length !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_388._M_string_length);
                }
              }
            }
            p_Var25 = local_158;
            if ((_Base_ptr)local_438._8_8_ != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_);
              p_Var25 = local_158;
            }
          }
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
        } while (p_Var16 != p_Var25);
      }
      peVar21 = (element_type *)local_3c8._16_8_;
      peVar2 = (element_type *)local_3c8._24_8_;
      pQVar23 = local_330;
      uVar3 = local_190._40_8_;
      if ((element_type *)local_518._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._8_8_);
        peVar21 = (element_type *)local_3c8._16_8_;
        peVar2 = (element_type *)local_3c8._24_8_;
        pQVar23 = local_330;
        uVar3 = local_190._40_8_;
      }
      for (; other = local_190._40_8_, pQVar26 = local_330, uVar22 = local_3c8._24_8_,
          local_330 = pQVar23, local_190._40_8_ = uVar3, peVar21 != (element_type *)local_3c8._24_8_
          ; peVar21 = (element_type *)
                      ((long)&(peVar21->value).
                              super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      + 0x10)) {
        local_3c8._24_8_ = peVar2;
        QPDFObjectHandle::getDict((QPDFObjectHandle *)(local_3a8 + 0x20));
        local_368._0_8_ = local_368 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"/Matrix","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_460,(string *)(local_3a8 + 0x20));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_358._0_8_ + 1);
        }
        QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_368);
        bVar27 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_460);
        if (bVar27) {
          QPDFObjectHandle::getArrayAsMatrix((Matrix *)local_518,(QPDFObjectHandle *)local_460);
          QPDFMatrix::QPDFMatrix((QPDFMatrix *)&local_438,(Matrix *)local_518);
          local_348 = local_418;
          QStack_340 = QStack_410;
          local_358._0_8_ = local_428._0_8_;
          local_358._8_8_ = local_428._8_8_;
          local_368._0_8_ = local_438._M_allocated_capacity;
          local_368._8_8_ = local_438._8_8_;
        }
        QPDFMatrix::concat((QPDFMatrix *)local_368,(QPDFMatrix *)other);
        QPDFObjectHandle::newFromMatrix((QPDFObjectHandle *)&local_438,(QPDFMatrix *)local_368);
        bVar27 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_460);
        if (bVar27) {
LAB_0015a0f5:
          local_518._0_8_ = local_508;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"/Matrix","");
          QPDFObjectHandle::replaceKey
                    ((QPDFObjectHandle *)(local_3a8 + 0x20),(string *)local_518,
                     (QPDFObjectHandle *)&local_438);
          if ((element_type *)local_518._0_8_ != (element_type *)local_508) {
            operator_delete((void *)local_518._0_8_,local_508._0_8_ + 1);
          }
        }
        else {
          QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_518);
          bVar27 = QPDFMatrix::operator!=((QPDFMatrix *)local_368,(QPDFMatrix *)local_518);
          if (bVar27) goto LAB_0015a0f5;
        }
        local_518._0_8_ = local_508;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"/Resources","");
        QPDFObjectHandle::getKey
                  ((QPDFObjectHandle *)(local_320 + 0x20),(string *)(local_3a8 + 0x20));
        if ((element_type *)local_518._0_8_ != (element_type *)local_508) {
          operator_delete((void *)local_518._0_8_,local_508._0_8_ + 1);
        }
        if ((local_4b8._24_8_ != 0) &&
           (bVar27 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_320 + 0x20)), bVar27)
           ) {
          local_2a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = *(element_type **)
                    &(peVar21->value).
                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          ;
          local_2a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)&(peVar21->value).
                        super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        .
                        super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        .
                        super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                + 8);
          if (local_2a0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_2a0.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_2a0.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_2a0.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_2a0.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::_Rb_tree(&local_98,
                     (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      *)local_4c8);
          adjustAppearanceStream
                    (pQVar26,&local_2a0,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      *)&local_98);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::~_Rb_tree(&local_98);
          if (local_2a0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_2a0.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
        }
        if (local_300.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_300.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((_Base_ptr)local_438._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_);
        }
        if ((element_type *)local_460._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_460._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._M_string_length);
        }
        peVar2 = (element_type *)local_3c8._24_8_;
        pQVar23 = local_330;
        uVar3 = local_190._40_8_;
        local_190._40_8_ = other;
        local_330 = pQVar26;
        local_3c8._24_8_ = uVar22;
      }
      local_518._0_8_ = local_508;
      local_3c8._24_8_ = peVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"/Rect","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_438,(string *)(local_508 + 0x20));
      QPDFObjectHandle::getArrayAsRectangle(&local_e8,(QPDFObjectHandle *)&local_438);
      r.lly = local_e8.lly;
      r.llx = local_e8.llx;
      r.urx._0_4_ = local_e8.urx._0_4_;
      r.urx._4_4_ = local_e8.urx._4_4_;
      r.ury._0_4_ = local_e8.ury._0_4_;
      r.ury._4_4_ = local_e8.ury._4_4_;
      QPDFMatrix::transformRectangle((Rectangle *)local_368,(QPDFMatrix *)other,r);
      if ((_Base_ptr)local_438._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_);
      }
      if ((element_type *)local_518._0_8_ != (element_type *)local_508) {
        operator_delete((void *)local_518._0_8_,local_508._0_8_ + 1);
      }
      local_518._0_8_ = local_508;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"/Rect","");
      QPDFObjectHandle::newFromRectangle((QPDFObjectHandle *)&local_438,(Rectangle *)local_368);
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)(local_508 + 0x20),(string *)local_518,
                 (QPDFObjectHandle *)&local_438);
      if ((_Base_ptr)local_438._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_);
      }
      if ((element_type *)local_518._0_8_ != (element_type *)local_508) {
        operator_delete((void *)local_518._0_8_,local_508._0_8_ + 1);
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)(local_3c8 + 0x10));
      if ((element_type *)local_320._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._8_8_);
      }
      QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_558);
      if ((QPDFObjGen)local_460._32_8_ != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_460._32_8_);
      }
      if ((element_type *)local_4b8._40_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b8._40_8_);
      }
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)local_408);
    }
    if ((QPDFObjGen)local_4e8._8_8_ != (QPDFObjGen)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_);
    }
    QPDFObjectHandle::QPDFArrayItems::iterator::operator++(&local_138);
  } while( true );
}

Assistant:

void
QPDFAcroFormDocumentHelper::transformAnnotations(
    QPDFObjectHandle old_annots,
    std::vector<QPDFObjectHandle>& new_annots,
    std::vector<QPDFObjectHandle>& new_fields,
    std::set<QPDFObjGen>& old_fields,
    QPDFMatrix const& cm,
    QPDF* from_qpdf,
    QPDFAcroFormDocumentHelper* from_afdh)
{
    std::shared_ptr<QPDFAcroFormDocumentHelper> afdhph;
    if (!from_qpdf) {
        // Assume these are from the same QPDF.
        from_qpdf = &qpdf;
        from_afdh = this;
    } else if ((from_qpdf != &qpdf) && (!from_afdh)) {
        afdhph = std::make_shared<QPDFAcroFormDocumentHelper>(*from_qpdf);
        from_afdh = afdhph.get();
    }
    bool foreign = (from_qpdf != &qpdf);

    // It's possible that we will transform annotations that don't include any form fields. This
    // code takes care not to muck around with /AcroForm unless we have to.

    QPDFObjectHandle acroform = qpdf.getRoot().getKey("/AcroForm");
    QPDFObjectHandle from_acroform = from_qpdf->getRoot().getKey("/AcroForm");

    // /DA and /Q may be inherited from the document-level /AcroForm dictionary. If we are copying a
    // foreign stream and the stream is getting one of these values from its document's /AcroForm,
    // we will need to copy the value explicitly so that it doesn't start getting its default from
    // the destination document.
    bool override_da = false;
    bool override_q = false;
    std::string from_default_da;
    int from_default_q = 0;
    // If we copy any form fields, we will need to merge the source document's /DR into this
    // document's /DR.
    QPDFObjectHandle from_dr = QPDFObjectHandle::newNull();
    if (foreign) {
        std::string default_da;
        int default_q = 0;
        if (acroform.isDictionary()) {
            if (acroform.getKey("/DA").isString()) {
                default_da = acroform.getKey("/DA").getUTF8Value();
            }
            if (acroform.getKey("/Q").isInteger()) {
                default_q = acroform.getKey("/Q").getIntValueAsInt();
            }
        }
        if (from_acroform.isDictionary()) {
            if (from_acroform.getKey("/DR").isDictionary()) {
                from_dr = from_acroform.getKey("/DR");
                if (!from_dr.isIndirect()) {
                    from_dr = from_qpdf->makeIndirectObject(from_dr);
                }
                from_dr = qpdf.copyForeignObject(from_dr);
            }
            if (from_acroform.getKey("/DA").isString()) {
                from_default_da = from_acroform.getKey("/DA").getUTF8Value();
            }
            if (from_acroform.getKey("/Q").isInteger()) {
                from_default_q = from_acroform.getKey("/Q").getIntValueAsInt();
            }
        }
        if (from_default_da != default_da) {
            override_da = true;
        }
        if (from_default_q != default_q) {
            override_q = true;
        }
    }

    // If we have to merge /DR, we will need a mapping of conflicting keys for rewriting /DA. Set
    // this up for lazy initialization in case we encounter any form fields.
    std::map<std::string, std::map<std::string, std::string>> dr_map;
    bool initialized_dr_map = false;
    QPDFObjectHandle dr = QPDFObjectHandle::newNull();
    auto init_dr_map = [&]() {
        if (!initialized_dr_map) {
            initialized_dr_map = true;
            // Ensure that we have a /DR that is an indirect
            // dictionary object.
            if (!acroform.isDictionary()) {
                acroform = getOrCreateAcroForm();
            }
            dr = acroform.getKey("/DR");
            if (!dr.isDictionary()) {
                dr = QPDFObjectHandle::newDictionary();
            }
            dr.makeResourcesIndirect(qpdf);
            if (!dr.isIndirect()) {
                dr = acroform.replaceKeyAndGetNew("/DR", qpdf.makeIndirectObject(dr));
            }
            // Merge the other document's /DR, creating a conflict map. mergeResources checks to
            // make sure both objects are dictionaries. By this point, if this is foreign, from_dr
            // has been copied, so we use the target qpdf as the owning qpdf.
            from_dr.makeResourcesIndirect(qpdf);
            dr.mergeResources(from_dr, &dr_map);

            if (from_afdh->getNeedAppearances()) {
                setNeedAppearances(true);
            }
        }
    };

    // This helper prevents us from copying the same object multiple times.
    std::map<QPDFObjGen, QPDFObjectHandle> orig_to_copy;
    auto maybe_copy_object = [&](QPDFObjectHandle& to_copy) {
        auto og = to_copy.getObjGen();
        if (orig_to_copy.count(og)) {
            to_copy = orig_to_copy[og];
            return false;
        } else {
            to_copy = qpdf.makeIndirectObject(to_copy.shallowCopy());
            orig_to_copy[og] = to_copy;
            return true;
        }
    };

    // Now do the actual copies.

    QPDFObjGen::set added_new_fields;
    for (auto annot: old_annots.aitems()) {
        if (annot.isStream()) {
            annot.warnIfPossible("ignoring annotation that's a stream");
            continue;
        }

        // Make copies of annotations and fields down to the appearance streams, preserving all
        // internal referential integrity. When the incoming annotations are from a different file,
        // we first copy them locally. Then, whether local or foreign, we copy them again so that if
        // we bring the same annotation in multiple times (e.g. overlaying a foreign page onto
        // multiple local pages or a local page onto multiple other local pages), we don't create
        // annotations that are referenced in more than one place. If we did that, the effect of
        // applying transformations would be cumulative, which is definitely not what we want.
        // Besides, annotations and fields are not intended to be referenced in multiple places.

        // Determine if this annotation is attached to a form field. If so, the annotation may be
        // the same object as the form field, or the form field may have the annotation as a kid. In
        // either case, we have to walk up the field structure to find the top-level field. Within
        // one iteration through a set of annotations, we don't want to copy the same item more than
        // once. For example, suppose we have field A with kids B, C, and D, each of which has
        // annotations BA, CA, and DA. When we get to BA, we will find that BA is a kid of B which
        // is under A. When we do a copyForeignObject of A, it will also copy everything else
        // because of the indirect references. When we clone BA, we will want to clone A and then
        // update A's clone's kid to point B's clone and B's clone's parent to point to A's clone.
        // The same thing holds for annotations. Next, when we get to CA, we will again discover
        // that A is the top, but we don't want to re-copy A. We want CA's clone to be linked to the
        // same clone as BA's. Failure to do this will break up things like radio button groups,
        // which all have to kids of the same parent.

        auto ffield = from_afdh->getFieldForAnnotation(annot);
        auto ffield_oh = ffield.getObjectHandle();
        QPDFObjectHandle top_field;
        bool have_field = false;
        bool have_parent = false;
        if (ffield_oh.isStream()) {
            ffield_oh.warnIfPossible("ignoring form field that's a stream");
        } else if ((!ffield_oh.isNull()) && (!ffield_oh.isIndirect())) {
            ffield_oh.warnIfPossible("ignoring form field not indirect");
        } else if (!ffield_oh.isNull()) {
            // A field and its associated annotation can be the same object. This matters because we
            // don't want to clone the annotation and field separately in this case.
            have_field = true;
            // Find the top-level field. It may be the field itself.
            top_field = ffield.getTopLevelField(&have_parent).getObjectHandle();
            if (foreign) {
                // copyForeignObject returns the same value if called multiple times with the same
                // field. Create/retrieve the local copy of the original field. This pulls over
                // everything the field references including annotations and appearance streams, but
                // it's harmless to call copyForeignObject on them too. They will already be copied,
                // so we'll get the right object back.

                // top_field and ffield_oh are known to be indirect.
                top_field = qpdf.copyForeignObject(top_field);
                ffield_oh = qpdf.copyForeignObject(ffield_oh);
            } else {
                // We don't need to add top_field to old_fields if it's foreign because the new copy
                // of the foreign field won't be referenced anywhere. It's just the starting point
                // for us to make an additional local copy of.
                old_fields.insert(top_field.getObjGen());
            }

            // Traverse the field, copying kids, and preserving integrity.
            std::list<QPDFObjectHandle> queue;
            QPDFObjGen::set seen;
            if (maybe_copy_object(top_field)) {
                queue.push_back(top_field);
            }
            for (; !queue.empty(); queue.pop_front()) {
                auto& obj = queue.front();
                if (seen.add(obj)) {
                    auto parent = obj.getKey("/Parent");
                    if (parent.isIndirect()) {
                        auto parent_og = parent.getObjGen();
                        if (orig_to_copy.count(parent_og)) {
                            obj.replaceKey("/Parent", orig_to_copy[parent_og]);
                        } else {
                            parent.warnIfPossible(
                                "while traversing field " + obj.getObjGen().unparse(',') +
                                ", found parent (" + parent_og.unparse(',') +
                                ") that had not been seen, indicating likely invalid field "
                                "structure");
                        }
                    }
                    auto kids = obj.getKey("/Kids");
                    if (kids.isArray()) {
                        for (int i = 0; i < kids.getArrayNItems(); ++i) {
                            auto kid = kids.getArrayItem(i);
                            if (maybe_copy_object(kid)) {
                                kids.setArrayItem(i, kid);
                                queue.push_back(kid);
                            }
                        }
                    }

                    if (override_da || override_q) {
                        adjustInheritedFields(
                            obj, override_da, from_default_da, override_q, from_default_q);
                    }
                    if (foreign) {
                        // Lazily initialize our /DR and the conflict map.
                        init_dr_map();
                        // The spec doesn't say anything about /DR on the field, but lots of writers
                        // put one there, and it is frequently the same as the document-level /DR.
                        // To avoid having the field's /DR point to information that we are not
                        // maintaining, just reset it to that if it exists. Empirical evidence
                        // suggests that many readers, including Acrobat, Adobe Acrobat Reader,
                        // chrome, firefox, the mac Preview application, and several of the free
                        // readers on Linux all ignore /DR at the field level.
                        if (obj.hasKey("/DR")) {
                            obj.replaceKey("/DR", dr);
                        }
                    }
                    if (foreign && obj.getKey("/DA").isString() && (!dr_map.empty())) {
                        adjustDefaultAppearances(obj, dr_map);
                    }
                }
            }

            // Now switch to copies. We already switched for top_field
            maybe_copy_object(ffield_oh);
            ffield = QPDFFormFieldObjectHelper(ffield_oh);
        }

        QTC::TC(
            "qpdf",
            "QPDFAcroFormDocumentHelper copy annotation",
            (have_field ? 1 : 0) | (foreign ? 2 : 0));
        if (have_field) {
            QTC::TC(
                "qpdf",
                "QPDFAcroFormDocumentHelper field with parent",
                (have_parent ? 1 : 0) | (foreign ? 2 : 0));
        }
        if (foreign) {
            if (!annot.isIndirect()) {
                annot = from_qpdf->makeIndirectObject(annot);
            }
            annot = qpdf.copyForeignObject(annot);
        }
        maybe_copy_object(annot);

        // Now we have copies, so we can safely mutate.
        if (have_field && added_new_fields.add(top_field)) {
            new_fields.push_back(top_field);
        }
        new_annots.push_back(annot);

        // Identify and copy any appearance streams

        auto ah = QPDFAnnotationObjectHelper(annot);
        auto apdict = ah.getAppearanceDictionary();
        std::vector<QPDFObjectHandle> streams;
        auto replace_stream = [](auto& dict, auto& key, auto& old) {
            return dict.replaceKeyAndGetNew(key, old.copyStream());
        };

        for (auto& [key1, value1]: apdict.as_dictionary()) {
            if (value1.isStream()) {
                streams.emplace_back(replace_stream(apdict, key1, value1));
            } else {
                for (auto& [key2, value2]: value1.as_dictionary()) {
                    if (value2.isStream()) {
                        streams.emplace_back(replace_stream(value1, key2, value2));
                    }
                }
            }
        }

        // Now we can safely mutate the annotation and its appearance streams.
        for (auto& stream: streams) {
            auto dict = stream.getDict();
            auto omatrix = dict.getKey("/Matrix");
            QPDFMatrix apcm;
            if (omatrix.isArray()) {
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper modify ap matrix");
                auto m1 = omatrix.getArrayAsMatrix();
                apcm = QPDFMatrix(m1);
            }
            apcm.concat(cm);
            auto new_matrix = QPDFObjectHandle::newFromMatrix(apcm);
            if (omatrix.isArray() || (apcm != QPDFMatrix())) {
                dict.replaceKey("/Matrix", new_matrix);
            }
            auto resources = dict.getKey("/Resources");
            if ((!dr_map.empty()) && resources.isDictionary()) {
                adjustAppearanceStream(stream, dr_map);
            }
        }
        auto rect = cm.transformRectangle(annot.getKey("/Rect").getArrayAsRectangle());
        annot.replaceKey("/Rect", QPDFObjectHandle::newFromRectangle(rect));
    }
}